

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O2

void R_DrawPSprite(DPSprite *pspr,AActor *owner,float bobx,float boby,double wx,double wy,
                  double ticfrac)

{
  visstyle_t *pvVar1;
  vissprite_t *vis;
  float fVar2;
  ushort uVar3;
  uint uVar4;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  lighttable_t *plVar5;
  lighttable_t *plVar6;
  undefined1 auVar7 [16];
  double dVar8;
  bool bVar9;
  vispsp_t *pvVar10;
  vissprite_t *pvVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  PalEntry fade;
  FTexture *this;
  AActor *p;
  AWeapon *pAVar15;
  FDynamicColormap *pFVar16;
  ulong uVar17;
  BYTE *pBVar18;
  AInventory *pAVar19;
  short sVar20;
  uint uVar21;
  long lVar22;
  short sVar23;
  int iVar24;
  uint uVar25;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  undefined4 uVar26;
  undefined4 uVar27;
  int iVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  FRenderStyle style;
  double local_58;
  undefined1 local_48 [16];
  
  local_48._8_4_ = in_XMM2_Dc;
  local_48._0_8_ = wx;
  local_48._12_4_ = in_XMM2_Dd;
  local_58 = wy;
  if ((R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis == '\0') &&
     (iVar28 = __cxa_guard_acquire(&R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)
                                    ::avis), iVar28 != 0)) {
    R_DrawPSprite::avis = (TArray<vissprite_t,_vissprite_t>)ZEXT816(0);
    __cxa_atexit(TArray<vissprite_t,_vissprite_t>::~TArray,&R_DrawPSprite::avis,&__dso_handle);
    __cxa_guard_release(&R_DrawPSprite(DPSprite*,AActor*,float,float,double,double,double)::avis);
  }
  if (R_DrawPSprite::avis.Count < vispspindex + 1) {
    TArray<vissprite_t,_vissprite_t>::Reserve
              (&R_DrawPSprite::avis,(R_DrawPSprite::avis.Count - vispspindex) + 1);
  }
  uVar4 = pspr->Sprite;
  if (sprites.Count <= uVar4) {
    DPrintf(1,"R_DrawPSprite: invalid sprite number %i\n");
    return;
  }
  if ((int)(uint)sprites.Array[(int)uVar4].numframes <= pspr->Frame) {
    DPrintf(1,"R_DrawPSprite: invalid sprite frame %i : %i\n");
    return;
  }
  lVar22 = (long)pspr->Frame + (ulong)sprites.Array[(int)uVar4].spriteframes;
  uVar3 = SpriteFrames.Array[lVar22].Flip;
  this = FTextureManager::operator()
                   (&TexMan,(FTextureID)SpriteFrames.Array[lVar22].Texture[0].texnum,false);
  if (this->UseType == '\r') {
    return;
  }
  if (pspr->firstTic == false) {
    auVar32._0_8_ = pspr->x;
    auVar32._8_8_ = pspr->y;
    uVar26 = *(undefined4 *)&pspr->oldx;
    uVar27 = *(undefined4 *)((long)&pspr->oldx + 4);
    uVar29 = *(undefined4 *)&pspr->oldy;
    uVar30 = *(undefined4 *)((long)&pspr->oldy + 4);
  }
  else {
    pspr->firstTic = false;
    auVar32._0_8_ = pspr->x;
    auVar32._8_8_ = pspr->y;
    pspr->oldx = (double)auVar32._0_8_;
    pspr->oldy = (double)auVar32._8_8_;
    uVar26 = (undefined4)auVar32._0_8_;
    uVar27 = (undefined4)((ulong)auVar32._0_8_ >> 0x20);
    uVar29 = (undefined4)auVar32._8_8_;
    uVar30 = (undefined4)((ulong)auVar32._8_8_ >> 0x20);
  }
  iVar28 = -(uint)((pspr->Flags & 2U) == 0);
  auVar33._4_4_ = iVar28;
  auVar33._0_4_ = iVar28;
  auVar33._8_4_ = iVar28;
  auVar33._12_4_ = iVar28;
  auVar7._8_4_ = SUB84((double)boby,0);
  auVar7._0_8_ = (double)bobx;
  auVar7._12_4_ = (int)((ulong)(double)boby >> 0x20);
  dVar31 = SUB168(~auVar33 & auVar7,0) +
           ticfrac * (auVar32._0_8_ - (double)CONCAT44(uVar27,uVar26)) +
           (double)CONCAT44(uVar27,uVar26);
  dVar34 = SUB168(~auVar33 & auVar7,8) +
           ticfrac * (auVar32._8_8_ - (double)CONCAT44(uVar30,uVar29)) +
           (double)CONCAT44(uVar30,uVar29);
  if (((pspr->Flags & 1U) != 0) && (pspr->ID != 1)) {
    dVar31 = dVar31 + (double)local_48._0_8_;
    dVar34 = dVar34 + local_58;
  }
  iVar28 = FTexture::GetScaledLeftOffset(this);
  dVar8 = (dVar31 + -160.0) - (double)iVar28;
  dVar31 = CenterX + 6755399441055744.0 + pspritexscale * dVar8;
  iVar28 = SUB84(dVar31,0);
  if (viewwidth < iVar28) {
    return;
  }
  iVar13 = FTexture::GetScaledWidth(this);
  dVar8 = CenterX + 6755399441055744.0 + (dVar8 + (double)iVar13) * pspritexscale;
  iVar13 = SUB84(dVar8,0);
  if (iVar13 < 1) {
    return;
  }
  uVar17 = (ulong)vispspindex;
  pvVar11 = R_DrawPSprite::avis.Array;
  R_DrawPSprite::avis.Array[uVar17].renderflags = (short)(owner->renderflags).Value;
  pvVar11[uVar17].floorclip = 0.0;
  vis = pvVar11 + uVar17;
  pvVar11[uVar17].field_14.field_0.texturemid =
       (double)(int)this->TopOffset + (100.0 - dVar34) * (this->Scale).Y;
  if ((camera->player != (player_t *)0x0) &&
     ((((DFrameBuffer *)RenderTarget != screen || (viewheight == RenderTarget->Height)) ||
      ((0x140 < RenderTarget->Width && (st_scale.Value == false)))))) {
    p = GC::ReadBarrier<AActor>((AActor **)&pspr->Caller);
    pAVar15 = dyn_cast<AWeapon>((DObject *)p);
    if ((pAVar15 != (AWeapon *)0x0) && (fVar2 = pAVar15->YAdjust, fVar2 != 0.0)) {
      if (((DFrameBuffer *)RenderTarget == screen) && (viewheight != RenderTarget->Height)) {
        dVar34 = (double)fVar2 * StatusBar->Displacement;
      }
      else {
        dVar34 = (double)fVar2;
      }
      (vis->field_14).field_0.texturemid = (vis->field_14).field_0.texturemid - dVar34;
    }
  }
  if (pspr->ID < 0x7ffffffd) {
    (vis->field_14).field_0.texturemid =
         (vis->field_14).field_0.texturemid - (double)BaseRatioSizes[WidescreenRatio][2];
  }
  iVar14 = 0;
  sVar20 = 0;
  if (0 < iVar28) {
    sVar20 = SUB82(dVar31,0);
  }
  vis->x1 = sVar20;
  sVar23 = (short)viewwidth;
  if (iVar13 < viewwidth) {
    sVar23 = SUB82(dVar8,0);
  }
  vis->x2 = sVar23;
  vis->xscale = SUB84(pspritexscale / (this->Scale).X + 103079215104.0,0);
  vis->yscale = (float)(pspriteyscale / (this->Scale).Y);
  vis->Translation = 0;
  (vis->field_13).pic = this;
  vis->ColormapNum = '\0';
  iVar13 = SUB84((this->Scale).X * pspritexiscale + 103079215104.0,0);
  if ((uVar3 & 1) == 0) {
    (vis->field_14).field_0.xiscale = iVar13;
  }
  else {
    iVar13 = -iVar13;
    (vis->field_14).field_0.xiscale = iVar13;
    iVar14 = *(int *)&this->Width * 0x10000 + -1;
  }
  iVar24 = 0;
  if (iVar28 < sVar20) {
    iVar24 = (sVar20 - iVar28) * iVar13;
  }
  (vis->field_14).field_0.startfrac = iVar24 + iVar14;
  pFVar16 = basecolormap;
  if (pspr->ID < 0x7ffffffd) {
    (vis->Style).Alpha = (float)owner->Alpha;
    uVar4 = (owner->RenderStyle).AsDWORD;
    uVar25 = uVar4 >> 0x18 & 0x20;
    uVar21 = uVar25 >> 5 ^ 1;
    if ((uVar4 >> 0x1c & 1) == 0) {
      uVar21 = uVar25;
    }
    (vis->Style).RenderStyle.AsDWORD = uVar4;
    pFVar16 = basecolormap;
    if ((uVar4 >> 0x1e & 1) != 0) {
      fade_00.d = 0xffffff;
      if (uVar21 == 0) {
        fade_00.d = 0;
      }
      pFVar16 = GetSpecialLights((PalEntry)(basecolormap->Color).field_0.field_0,(PalEntry)fade_00,
                                 basecolormap->Desaturate);
      uVar21 = 0;
    }
    pvVar1 = &vis->Style;
    if (realfixedcolormap == (FSpecialColormap *)0x0) {
      if (uVar21 != 0) {
        color = (pFVar16->Color).field_0.field_0;
        fade = PalEntry::InverseColor(&pFVar16->Fade);
        pFVar16 = GetSpecialLights((PalEntry)color,fade,pFVar16->Desaturate);
      }
      uVar17 = (ulong)fixedlightlev;
      if ((long)uVar17 < 0) {
        if ((foggy == false) && ((pspr->State->field_0x22 & 1) != 0)) {
          pBVar18 = pFVar16->Maps;
          goto LAB_0033c8da;
        }
        iVar13 = 0x1f;
        if (spriteshade._2_2_ < 0x1f) {
          iVar13 = (int)spriteshade._2_2_;
        }
        iVar14 = 0;
        if (0 < iVar13) {
          iVar14 = iVar13;
        }
        uVar17 = (ulong)(uint)(iVar14 << 8);
      }
      pBVar18 = pFVar16->Maps + uVar17;
    }
    else {
      pBVar18 = realfixedcolormap->Colormap;
    }
LAB_0033c8da:
    pvVar1->colormap = pBVar18;
    pAVar19 = GC::ReadBarrier<AInventory>((AInventory **)&camera->Inventory);
    if (pAVar19 == (AInventory *)0x0) {
      bVar12 = false;
    }
    else {
      plVar5 = pvVar1->colormap;
      pAVar19 = GC::ReadBarrier<AInventory>((AInventory **)&camera->Inventory);
      (*(pAVar19->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3f])(pAVar19,pvVar1);
      plVar6 = pvVar1->colormap;
      if (plVar6 == plVar5) {
        bVar12 = false;
      }
      else {
        bVar12 = true;
        if (((SpecialColormaps.Array)->Colormap <= plVar6) &&
           (plVar6 <= SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap)) {
          bVar12 = pFVar16->Maps + 0x2000 <= plVar6 || plVar6 < pFVar16->Maps;
        }
      }
    }
    bVar9 = bVar12;
    if (((r_shadercolormaps.Value == false) &&
        ((SpecialColormaps.Array)->Colormap <= pvVar1->colormap)) &&
       (bVar9 = true, SpecialColormaps.Array[SpecialColormaps.Count - 1].Colormap < pvVar1->colormap
       )) {
      bVar9 = bVar12;
    }
    bVar12 = true;
    if (NormalLight.Maps == realcolormaps) {
      bVar12 = bVar9;
    }
    if (pFVar16 == &NormalLight) {
      bVar9 = bVar12;
    }
    if ((((!bVar9) && (realfixedcolormap == (FSpecialColormap *)0x0)) &&
        ((pFVar16 == &NormalLight &&
         (((NormalLightHasFixedLights & 1U) != 0 &&
          (iVar13 = (*((vis->field_13).pic)->_vptr_FTexture[5])(), pFVar16 = &NormalLight,
          bVar9 = bVar12, (char)iVar13 != '\0')))))) || (bVar9)) goto LAB_0033ca21;
  }
  else {
    (vis->Style).colormap = basecolormap->Maps;
    (vis->Style).RenderStyle = LegacyRenderStyles[1];
  }
  if (((DFrameBuffer *)RenderTarget == screen) && (screen->Accel2D != false)) {
    style = (vis->Style).RenderStyle;
    FRenderStyle::CheckFuzz(&style);
    if (style.field_0.BlendOp != '\x04') {
      if (vispsprites.Count < vispspindex + 1) {
        TArray<vispsp_t,_vispsp_t>::Reserve(&vispsprites,(vispsprites.Count - vispspindex) + 1);
      }
      pvVar10 = vispsprites.Array;
      uVar17 = (ulong)vispspindex;
      vispsprites.Array[uVar17].vis = vis;
      pvVar10[uVar17].basecolormap = pFVar16;
      pvVar10[uVar17].x1 = iVar28;
      vispspindex = vispspindex + 1;
      return;
    }
  }
LAB_0033ca21:
  R_DrawVisSprite(vis);
  return;
}

Assistant:

void R_DrawPSprite(DPSprite *pspr, AActor *owner, float bobx, float boby, double wx, double wy, double ticfrac)
{
	double 				tx;
	int 				x1;
	int 				x2;
	double				sx, sy;
	spritedef_t*		sprdef;
	spriteframe_t*		sprframe;
	FTextureID			picnum;
	WORD				flip;
	FTexture*			tex;
	vissprite_t*		vis;
	bool				noaccel;
	static TArray<vissprite_t> avis;

	if (avis.Size() < vispspindex + 1)
		avis.Reserve(avis.Size() - vispspindex + 1);

	// decide which patch to use
	if ((unsigned)pspr->GetSprite() >= (unsigned)sprites.Size())
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite number %i\n", pspr->GetSprite());
		return;
	}
	sprdef = &sprites[pspr->GetSprite()];
	if (pspr->GetFrame() >= sprdef->numframes)
	{
		DPrintf(DMSG_ERROR, "R_DrawPSprite: invalid sprite frame %i : %i\n", pspr->GetSprite(), pspr->GetFrame());
		return;
	}
	sprframe = &SpriteFrames[sprdef->spriteframes + pspr->GetFrame()];

	picnum = sprframe->Texture[0];
	flip = sprframe->Flip & 1;
	tex = TexMan(picnum);

	if (tex->UseType == FTexture::TEX_Null)
		return;

	if (pspr->firstTic)
	{ // Can't interpolate the first tic.
		pspr->firstTic = false;
		pspr->oldx = pspr->x;
		pspr->oldy = pspr->y;
	}

	sx = pspr->oldx + (pspr->x - pspr->oldx) * ticfrac;
	sy = pspr->oldy + (pspr->y - pspr->oldy) * ticfrac;

	if (pspr->Flags & PSPF_ADDBOB)
	{
		sx += bobx;
		sy += boby;
	}

	if (pspr->Flags & PSPF_ADDWEAPON && pspr->GetID() != PSP_WEAPON)
	{
		sx += wx;
		sy += wy;
	}

	// calculate edges of the shape
	tx = sx - BASEXCENTER;

	tx -= tex->GetScaledLeftOffset();
	x1 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the right side
	if (x1 > viewwidth)
		return;

	tx += tex->GetScaledWidth();
	x2 = xs_RoundToInt(CenterX + tx * pspritexscale);

	// off the left side
	if (x2 <= 0)
		return;

	// store information in a vissprite
	vis = &avis[vispspindex];
	vis->renderflags = owner->renderflags;
	vis->floorclip = 0;

	vis->texturemid = (BASEYCENTER - sy) * tex->Scale.Y + tex->TopOffset;

	if (camera->player && (RenderTarget != screen ||
		viewheight == RenderTarget->GetHeight() ||
		(RenderTarget->GetWidth() > (BASEXCENTER * 2) && !st_scale)))
	{	// Adjust PSprite for fullscreen views
		AWeapon *weapon = dyn_cast<AWeapon>(pspr->GetCaller());
		if (weapon != nullptr && weapon->YAdjust != 0)
		{
			if (RenderTarget != screen || viewheight == RenderTarget->GetHeight())
			{
				vis->texturemid -= weapon->YAdjust;
			}
			else
			{
				vis->texturemid -= StatusBar->GetDisplacement() * weapon->YAdjust;
			}
		}
	}
	if (pspr->GetID() < PSP_TARGETCENTER)
	{ // Move the weapon down for 1280x1024.
		vis->texturemid -= BaseRatioSizes[WidescreenRatio][2];
	}
	vis->x1 = x1 < 0 ? 0 : x1;
	vis->x2 = x2 >= viewwidth ? viewwidth : x2;
	vis->xscale = FLOAT2FIXED(pspritexscale / tex->Scale.X);
	vis->yscale = float(pspriteyscale / tex->Scale.Y);
	vis->Translation = 0;		// [RH] Use default colors
	vis->pic = tex;
	vis->ColormapNum = 0;

	if (flip)
	{
		vis->xiscale = -FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = (tex->GetWidth() << FRACBITS) - 1;
	}
	else
	{
		vis->xiscale = FLOAT2FIXED(pspritexiscale * tex->Scale.X);
		vis->startfrac = 0;
	}

	if (vis->x1 > x1)
		vis->startfrac += vis->xiscale*(vis->x1 - x1);

	noaccel = false;
	FDynamicColormap *colormap_to_use = nullptr;
	if (pspr->GetID() < PSP_TARGETCENTER)
	{
		vis->Style.Alpha = float(owner->Alpha);
		vis->Style.RenderStyle = owner->RenderStyle;

		// The software renderer cannot invert the source without inverting the overlay
		// too. That means if the source is inverted, we need to do the reverse of what
		// the invert overlay flag says to do.
		INTBOOL invertcolormap = (vis->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

		if (vis->Style.RenderStyle.Flags & STYLEF_InvertSource)
		{
			invertcolormap = !invertcolormap;
		}

		FDynamicColormap *mybasecolormap = basecolormap;

		if (vis->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
		{
			if (invertcolormap)
			{ // Fade to white
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255, 255, 255), mybasecolormap->Desaturate);
				invertcolormap = false;
			}
			else
			{ // Fade to black
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0, 0, 0), mybasecolormap->Desaturate);
			}
		}

		if (realfixedcolormap != nullptr)
		{ // fixed color
			vis->Style.colormap = realfixedcolormap->Colormap;
		}
		else
		{
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				vis->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && pspr->GetState()->GetFullbright())
			{ // full bright
				vis->Style.colormap = mybasecolormap->Maps;	// [RH] use basecolormap
			}
			else
			{ // local light
				vis->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(0, spriteshade) << COLORMAPSHIFT);
			}
		}
		if (camera->Inventory != nullptr)
		{
			lighttable_t *oldcolormap = vis->Style.colormap;
			camera->Inventory->AlterWeaponSprite(&vis->Style);
			if (vis->Style.colormap != oldcolormap)
			{
				// The colormap has changed. Is it one we can easily identify?
				// If not, then don't bother trying to identify it for
				// hardware accelerated drawing.
				if (vis->Style.colormap < SpecialColormaps[0].Colormap ||
					vis->Style.colormap > SpecialColormaps.Last().Colormap)
				{
					noaccel = true;
				}
				// Has the basecolormap changed? If so, we can't hardware accelerate it,
				// since we don't know what it is anymore.
				else if (vis->Style.colormap < mybasecolormap->Maps ||
					vis->Style.colormap >= mybasecolormap->Maps + NUMCOLORMAPS * 256)
				{
					noaccel = true;
				}
			}
		}
		// If we're drawing with a special colormap, but shaders for them are disabled, do
		// not accelerate.
		if (!r_shadercolormaps && (vis->Style.colormap >= SpecialColormaps[0].Colormap &&
			vis->Style.colormap <= SpecialColormaps.Last().Colormap))
		{
			noaccel = true;
		}
		// If drawing with a BOOM colormap, disable acceleration.
		if (mybasecolormap == &NormalLight && NormalLight.Maps != realcolormaps)
		{
			noaccel = true;
		}
		// If the main colormap has fixed lights, and this sprite is being drawn with that
		// colormap, disable acceleration so that the lights can remain fixed.
		if (!noaccel && realfixedcolormap == nullptr &&
			NormalLightHasFixedLights && mybasecolormap == &NormalLight &&
			vis->pic->UseBasePalette())
		{
			noaccel = true;
		}
		colormap_to_use = mybasecolormap;
	}
	else
	{
		colormap_to_use = basecolormap;
		vis->Style.colormap = basecolormap->Maps;
		vis->Style.RenderStyle = STYLE_Normal;
	}

	// Check for hardware-assisted 2D. If it's available, and this sprite is not
	// fuzzy, don't draw it until after the switch to 2D mode.
	if (!noaccel && RenderTarget == screen && (DFrameBuffer *)screen->Accel2D)
	{
		FRenderStyle style = vis->Style.RenderStyle;
		style.CheckFuzz();
		if (style.BlendOp != STYLEOP_Fuzz)
		{
			if (vispsprites.Size() < vispspindex + 1)
				vispsprites.Reserve(vispsprites.Size() - vispspindex + 1);

			vispsprites[vispspindex].vis = vis;
			vispsprites[vispspindex].basecolormap = colormap_to_use;
			vispsprites[vispspindex].x1 = x1;
			vispspindex++;
			return;
		}
	}
	R_DrawVisSprite(vis);
}